

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t copy_string(archive_read *a,wchar_t len,wchar_t dist)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  pvVar1 = a->format->data;
  if (*(long *)((long)pvVar1 + 0x50) != 0) {
    if (L'\0' < len) {
      uVar2 = *(ulong *)((long)pvVar1 + 0x68);
      uVar4 = (ulong)(uint)len;
      uVar3 = *(long *)((long)pvVar1 + 0x70) + *(long *)((long)pvVar1 + 0x88);
      do {
        *(undefined1 *)(*(long *)((long)pvVar1 + 0x50) + (uVar3 & uVar2)) =
             *(undefined1 *)(*(long *)((long)pvVar1 + 0x50) + (uVar3 - (long)dist & uVar2));
        uVar3 = uVar3 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    *(long *)((long)pvVar1 + 0x70) = *(long *)((long)pvVar1 + 0x70) + (long)len;
    return L'\0';
  }
  return L'\xffffffe2';
}

Assistant:

static int copy_string(struct archive_read* a, int len, int dist) {
	struct rar5* rar = get_context(a);
	const ssize_t cmask = rar->cstate.window_mask;
	const uint64_t write_ptr = rar->cstate.write_ptr +
	    rar->cstate.solid_offset;
	int i;

	if (rar->cstate.window_buf == NULL)
		return ARCHIVE_FATAL;

	/* The unpacker spends most of the time in this function. It would be
	 * a good idea to introduce some optimizations here.
	 *
	 * Just remember that this loop treats buffers that overlap differently
	 * than buffers that do not overlap. This is why a simple memcpy(3)
	 * call will not be enough. */

	for(i = 0; i < len; i++) {
		const ssize_t write_idx = (write_ptr + i) & cmask;
		const ssize_t read_idx = (write_ptr + i - dist) & cmask;
		rar->cstate.window_buf[write_idx] =
		    rar->cstate.window_buf[read_idx];
	}

	rar->cstate.write_ptr += len;
	return ARCHIVE_OK;
}